

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

bool __thiscall cmCTestSVN::LoadRevisions(cmCTestSVN *this)

{
  bool bVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->Repositories).
           super__List_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)&this->Repositories) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    do {
      bVar1 = LoadRevisions(this,(SVNInfo *)(p_Var3 + 1));
      bVar2 = (bool)(bVar2 & bVar1);
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->Repositories);
  }
  return bVar2;
}

Assistant:

bool cmCTestSVN::LoadRevisions()
{
  bool result = true;
  // Get revisions for all the external repositories
  for (SVNInfo& svninfo : this->Repositories) {
    result = this->LoadRevisions(svninfo) && result;
  }
  return result;
}